

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O0

bool Internal_GetAlterateTangent
               (ON_SubDMatrix *subd_matrix,uint Ldex,size_t point_ring_count,
               size_t point_ring_stride,double *point_ring,double (*L) [3],double *alternate_tangent
               )

{
  ON_SubDVertexTag OVar1;
  bool bVar2;
  undefined1 local_88 [8];
  ON_3dVector V;
  ON_3dPoint Q;
  ON_3dPoint C;
  double (*L_local) [3];
  double *point_ring_local;
  size_t point_ring_stride_local;
  size_t point_ring_count_local;
  uint Ldex_local;
  ON_SubDMatrix *subd_matrix_local;
  
  if ((((3 < point_ring_count) && (2 < point_ring_stride)) && (point_ring != (double *)0x0)) &&
     (((Ldex == 2 && (subd_matrix->m_R == 4)) &&
      (OVar1 = ON_SubDSectorType::VertexTag(&subd_matrix->m_sector_type), OVar1 == Crease)))) {
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&Q.z,point_ring);
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&V.z,point_ring + point_ring_stride * 2);
    ON_3dPoint::operator-((ON_3dVector *)local_88,(ON_3dPoint *)&V.z,(ON_3dPoint *)&Q.z);
    bVar2 = ON_3dVector::IsNotZero((ON_3dVector *)local_88);
    if (bVar2) {
      *alternate_tangent = (double)local_88;
      alternate_tangent[1] = V.x;
      alternate_tangent[2] = V.y;
      return true;
    }
  }
  return false;
}

Assistant:

static bool Internal_GetAlterateTangent(
  const ON_SubDMatrix& subd_matrix,
  unsigned int Ldex,
  size_t point_ring_count,
  size_t point_ring_stride,
  const double* point_ring,
  const double L[3][3],
  double* alternate_tangent
)
{
  if (point_ring_count < 4 || point_ring_stride < 3 || nullptr == point_ring)
    return false;

  if (2 == Ldex)
  {
    if ( 4 == subd_matrix.m_R && ON_SubDVertexTag::Crease == subd_matrix.m_sector_type.VertexTag() )
    {
      // valence 2 crease case when crease edges are collinear
      // F = face point, C = crease vertex point.
      // Default tangents:
      //   L[1] = ON_3dPoint(point_ring +  point_ring_stride) - ON_3dPoint(point_ring + 3 * point_ring_stride);
      const ON_3dPoint C(point_ring);
      const ON_3dPoint Q(point_ring + 2 * point_ring_stride);
      ON_3dVector V(Q - C);
      if (V.IsNotZero())
      {
        alternate_tangent[0] = V.x;
        alternate_tangent[1] = V.y;
        alternate_tangent[2] = V.z;
        return true;
      }
    }
  }

  return false;
}